

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonAppendSqlValue(JsonString *p,sqlite3_value *pValue)

{
  sqlite3_context *psVar1;
  double dVar2;
  int iVar3;
  u32 uVar4;
  char *zIn;
  Mem *pMem;
  long in_FS_OFFSET;
  JsonParse local_68;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  switch("\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x04\x05\x03\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05"
         [pValue->flags & 0x3f]) {
  case '\x01':
    zIn = (char *)sqlite3ValueText(pValue,'\x01');
    uVar4 = sqlite3ValueBytes(pValue,'\x01');
    goto LAB_001bc683;
  case '\x02':
    dVar2 = sqlite3VdbeRealValue(pValue);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      jsonPrintf(100,p,"%!0.15g",SUB84(dVar2,0));
      return;
    }
    break;
  case '\x03':
    zIn = (char *)sqlite3ValueText(pValue,'\x01');
    uVar4 = sqlite3ValueBytes(pValue,'\x01');
    if (((pValue->flags & 0x800) == 0) || (pValue->eSubtype != 'J')) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        jsonAppendString(p,zIn,uVar4);
        return;
      }
      break;
    }
LAB_001bc683:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      jsonAppendRaw(p,zIn,uVar4);
      return;
    }
    break;
  default:
    iVar3 = jsonFuncArgMightBeBinary(pValue);
    if (iVar3 == 0) {
      if (p->eErr == '\0') {
        psVar1 = p->pCtx;
        psVar1->isError = 1;
        sqlite3VdbeMemSetStr
                  (psVar1->pOut,"JSON cannot hold BLOB values",-1,'\x01',
                   (_func_void_void_ptr *)0xffffffffffffffff);
        p->eErr = '\x04';
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          jsonStringReset(p);
          return;
        }
        break;
      }
    }
    else {
      local_68.nIns = 0;
      local_68.iLabel = 0;
      local_68.aIns = (u8 *)0x0;
      local_68.iErr = 0;
      local_68.iDepth = 0;
      local_68.nErr = '\0';
      local_68.oom = '\0';
      local_68.bJsonIsRCStr = '\0';
      local_68.hasNonstd = '\0';
      local_68.bReadOnly = '\0';
      local_68.eEdit = '\0';
      local_68.delta = 0;
      local_68.db = (sqlite3 *)0x0;
      local_68.nJson = 0;
      local_68.nJPRef = 0;
      local_68.nBlob = 0;
      local_68.nBlobAlloc = 0;
      local_68.zJson = (char *)0x0;
      local_68.aBlob = (u8 *)sqlite3_value_blob(pValue);
      uVar4 = sqlite3ValueBytes(pValue,'\x01');
      local_68.nBlob = uVar4;
      jsonTranslateBlobToText(&local_68,0,p);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
    break;
  case '\x05':
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      jsonAppendRawNZ(p,"null",4);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

static void jsonAppendSqlValue(
  JsonString *p,                 /* Append to this JSON string */
  sqlite3_value *pValue          /* Value to append */
){
  switch( sqlite3_value_type(pValue) ){
    case SQLITE_NULL: {
      jsonAppendRawNZ(p, "null", 4);
      break;
    }
    case SQLITE_FLOAT: {
      jsonPrintf(100, p, "%!0.15g", sqlite3_value_double(pValue));
      break;
    }
    case SQLITE_INTEGER: {
      const char *z = (const char*)sqlite3_value_text(pValue);
      u32 n = (u32)sqlite3_value_bytes(pValue);
      jsonAppendRaw(p, z, n);
      break;
    }
    case SQLITE_TEXT: {
      const char *z = (const char*)sqlite3_value_text(pValue);
      u32 n = (u32)sqlite3_value_bytes(pValue);
      if( sqlite3_value_subtype(pValue)==JSON_SUBTYPE ){
        jsonAppendRaw(p, z, n);
      }else{
        jsonAppendString(p, z, n);
      }
      break;
    }
    default: {
      if( jsonFuncArgMightBeBinary(pValue) ){
        JsonParse px;
        memset(&px, 0, sizeof(px));
        px.aBlob = (u8*)sqlite3_value_blob(pValue);
        px.nBlob = sqlite3_value_bytes(pValue);
        jsonTranslateBlobToText(&px, 0, p);
      }else if( p->eErr==0 ){
        sqlite3_result_error(p->pCtx, "JSON cannot hold BLOB values", -1);
        p->eErr = JSTRING_ERR;
        jsonStringReset(p);
      }
      break;
    }
  }
}